

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O0

void __thiscall
anurbs::Entry<anurbs::BrepTrim>::Entry
          (Entry<anurbs::BrepTrim> *this,shared_ptr<anurbs::BrepTrim> *data,
          shared_ptr<anurbs::Attributes> *attributes)

{
  shared_ptr<anurbs::Attributes> *attributes_local;
  shared_ptr<anurbs::BrepTrim> *data_local;
  Entry<anurbs::BrepTrim> *this_local;
  
  EntryBase::EntryBase(&this->super_EntryBase);
  (this->super_EntryBase)._vptr_EntryBase = (_func_int **)&PTR_key_abi_cxx11__007773c8;
  std::__cxx11::string::string((string *)&this->m_key);
  std::shared_ptr<anurbs::BrepTrim>::shared_ptr(&this->m_data,data);
  std::shared_ptr<anurbs::Attributes>::shared_ptr(&this->m_attributes,attributes);
  return;
}

Assistant:

Entry(std::shared_ptr<TData> data, std::shared_ptr<Attributes> attributes)
        : m_data(data), m_attributes(attributes)
    {
    }